

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instruction.h
# Opt level: O0

void __thiscall
spvtools::opt::Instruction::ForEachInId(Instruction *this,function<void_(unsigned_int_*)> *f)

{
  anon_class_8_1_54a39806 local_40;
  function<bool_(unsigned_int_*)> local_38;
  function<void_(unsigned_int_*)> *local_18;
  function<void_(unsigned_int_*)> *f_local;
  Instruction *this_local;
  
  local_40.f = (function<void_(const_unsigned_int_*)> *)f;
  local_18 = f;
  f_local = (function<void_(unsigned_int_*)> *)this;
  std::function<bool(unsigned_int*)>::
  function<spvtools::opt::Instruction::ForEachInId(std::function<void(unsigned_int*)>const&)::_lambda(unsigned_int*)_1_,void>
            ((function<bool(unsigned_int*)> *)&local_38,&local_40);
  WhileEachInId(this,&local_38);
  std::function<bool_(unsigned_int_*)>::~function(&local_38);
  return;
}

Assistant:

inline void Instruction::ForEachInId(const std::function<void(uint32_t*)>& f) {
  WhileEachInId([&f](uint32_t* id) {
    f(id);
    return true;
  });
}